

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,cmLocalUnixMakefileGenerator3 *lg)

{
  pointer pcVar1;
  long *plVar2;
  pointer puVar3;
  cmState *this_00;
  cmGeneratorTarget *this_01;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  size_t sVar12;
  cmValue cVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  pointer puVar14;
  pointer puVar15;
  char *pcVar16;
  pointer pbVar17;
  pointer puVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  string_view source;
  string_view source_00;
  string localName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_2f8;
  string makeTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string tmp;
  string local_258;
  string name;
  EchoProgress progress;
  string makefileName;
  ostringstream progressArg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  char *local_198;
  undefined8 local_190;
  ios_base local_148 [264];
  pointer local_40;
  ProgressMapType *local_38;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  _progressArg = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&progressArg,"CMAKE_SUPPRESS_REGENERATION","");
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&progressArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_progressArg != &local_1a8) {
    operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  puVar15 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != puVar14) {
    local_38 = &this->ProgressMap;
    local_40 = puVar14;
    do {
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar15->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name,pcVar1,pcVar1 + psVar9->_M_string_length);
      if (name._M_string_length != 0) {
        bVar7 = cmGeneratorTarget::IsInBuildSystem
                          ((puVar15->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (bVar7) {
          TVar8 = cmGeneratorTarget::GetType
                            ((puVar15->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (TVar8 != GLOBAL_TARGET) {
            makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
            makefileName._M_string_length = 0;
            makefileName.field_2._M_local_buf[0] = '\0';
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      ((string *)&progressArg,lg,
                       (puVar15->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
            }
            _progressArg = (pointer)localName._M_string_length;
            local_1a8._M_allocated_capacity = 0;
            local_1a8._8_8_ = 0xb;
            local_198 = "/build.make";
            local_190 = 0;
            views._M_len = 2;
            views._M_array = (iterator)&progressArg;
            cmCatViews(&progress.Dir,views);
            std::__cxx11::string::operator=((string *)&makefileName,(string *)&progress);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
              operator_delete(progress.Dir._M_dataplus._M_p,
                              CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                       progress.Dir.field_2._M_local_buf[0]) + 1);
            }
            cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
            std::__ostream_insert<char,std::char_traits<char>>
                      (ruleFileStream,"# Target rules for target ",0x1a);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (ruleFileStream,localName._M_dataplus._M_p,
                                 localName._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n\n",2);
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            paVar19 = &progress.Dir.field_2;
            _progressArg = (pointer)localName._M_string_length;
            local_1a8._M_allocated_capacity = 0;
            local_1a8._8_8_ = 7;
            local_198 = "/depend";
            local_190 = 0;
            views_00._M_len = 2;
            views_00._M_array = (iterator)&progressArg;
            cmCatViews(&progress.Dir,views_00);
            std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&progress);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)progress.Dir._M_dataplus._M_p != paVar19) {
              operator_delete(progress.Dir._M_dataplus._M_p,
                              CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                       progress.Dir.field_2._M_local_buf[0]) + 1);
            }
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&makefileName,&makeTargetName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
            }
            _progressArg = (pointer)localName._M_string_length;
            local_1a8._M_allocated_capacity = 0;
            local_1a8._8_8_ = 6;
            local_198 = "/build";
            local_190 = 0;
            views_01._M_len = 2;
            views_01._M_array = (iterator)&progressArg;
            cmCatViews(&progress.Dir,views_01);
            std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&progress);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)progress.Dir._M_dataplus._M_p != paVar19) {
              operator_delete(progress.Dir._M_dataplus._M_p,
                              CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                       progress.Dir.field_2._M_local_buf[0]) + 1);
            }
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&makefileName,&makeTargetName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&localName);
            pbVar5 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
            progress.Dir._M_string_length = 0;
            progress.Dir.field_2._M_local_buf[0] = '\0';
            progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
            progress.Arg._M_string_length = 0;
            progress.Arg.field_2._M_local_buf[0] = '\0';
            psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
            _progressArg = (pointer)psVar9->_M_string_length;
            local_1a8._M_allocated_capacity = 0;
            local_1a8._8_8_ = 0xb;
            local_198 = "/CMakeFiles";
            local_190 = 0;
            views_02._M_len = 2;
            views_02._M_array = (iterator)&progressArg;
            cmCatViews(&tmp,views_02);
            std::__cxx11::string::operator=((string *)&progress,(string *)&tmp);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp._M_dataplus._M_p != &tmp.field_2) {
              operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
            tmp._M_dataplus._M_p =
                 (pointer)(puVar15->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            pmVar11 = std::
                      map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                      ::operator[](local_38,(key_type *)&tmp);
            puVar18 = (pmVar11->Marks).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar3 = (pmVar11->Marks).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (puVar18 != puVar3) {
              pcVar16 = "";
              do {
                sVar12 = strlen(pcVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&progressArg,pcVar16,sVar12);
                std::ostream::_M_insert<unsigned_long>((ulong)&progressArg);
                puVar18 = puVar18 + 1;
                pcVar16 = ",";
              } while (puVar18 != puVar3);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&tmp);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp._M_dataplus._M_p != &tmp.field_2) {
              operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
            std::ios_base::~ios_base(local_148);
            this_00 = (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
                      ->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                      _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
            _progressArg = (pointer)&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&progressArg,"TARGET_MESSAGES","");
            cVar13 = cmState::GetGlobalProperty(this_00,(string *)&progressArg);
            pcVar16 = extraout_RDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
              pcVar16 = extraout_RDX_00;
            }
            if (cVar13.Value == (string *)0x0) {
LAB_0062ecc3:
              std::operator+((string *)&progressArg,"Built target ",&name);
              cmLocalUnixMakefileGenerator3::AppendEcho
                        (lg,&commands,(string *)&progressArg,EchoNormal,&progress);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_progressArg != &local_1a8) {
                operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
              }
            }
            else {
              value._M_str = pcVar16;
              value._M_len = (size_t)((cVar13.Value)->_M_dataplus)._M_p;
              bVar7 = cmValue::IsOn((cmValue *)(cVar13.Value)->_M_string_length,value);
              if (bVar7) goto LAB_0062ecc3;
            }
            AppendGlobalTargetDepends
                      (this,&depends,
                       (puVar15->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"All Build rule for target.",&localName,&depends,
                       &commands,true,false);
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
            source._M_str = progress.Dir._M_dataplus._M_p;
            source._M_len = progress.Dir._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      (&tmp,(cmOutputConverter *)lg,source,SHELL,false);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&progressArg,tmp._M_dataplus._M_p,
                       CONCAT44(tmp._M_string_length._4_4_,(undefined4)tmp._M_string_length));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp._M_dataplus._M_p != &tmp.field_2) {
              operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
            }
            tmp._M_string_length._0_4_ = 0;
            tmp.field_2._M_allocated_capacity = 0;
            tmp.field_2._8_8_ = &tmp._M_string_length;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&progressArg," ",1);
            CountProgressMarksInTarget
                      (this,(puVar15->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        *)&tmp);
            std::ostream::_M_insert<unsigned_long>((ulong)&progressArg);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                         *)&tmp);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
            std::ios_base::~ios_base(local_148);
            tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&tmp,"CMakeFiles/Makefile2","");
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&tmp,&localName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
            source_00._M_str = progress.Dir._M_dataplus._M_p;
            source_00._M_len = progress.Dir._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      (&local_2f8,(cmOutputConverter *)lg,source_00,SHELL,false);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&progressArg,local_2f8._M_dataplus._M_p,local_2f8._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&progressArg," 0",2);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
            std::ios_base::~ios_base(local_148);
            pbVar5 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            if (!bVar6) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[25]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &depends,(char (*) [25])"cmake_check_build_system");
            }
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_258,lg,
                       (puVar15->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            _progressArg = (pointer)local_258._M_string_length;
            local_1a8._8_8_ = 5;
            local_198 = "/rule";
            local_190 = 0;
            views_03._M_len = 2;
            views_03._M_array = (iterator)&progressArg;
            local_1a8._M_allocated_capacity = (size_type)&local_258;
            cmCatViews(&local_2f8,views_03);
            std::__cxx11::string::operator=((string *)&localName,(string *)&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"Build rule for subdir invocation for target.",
                       &localName,&depends,&commands,true,false);
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            pbVar5 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&depends,&localName);
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"Convenience name for target.",&name,&depends,&commands
                       ,true,false);
            this_01 = (puVar15->_M_t).
                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                      .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_((string *)&progressArg,lg);
            bVar7 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,(ulong)(local_1a8._M_allocated_capacity + 1));
            }
            if (bVar7) {
              cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                        (&local_258,lg,
                         (puVar15->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
              _progressArg = (pointer)local_258._M_string_length;
              local_1a8._8_8_ = 0xb;
              local_198 = "/preinstall";
              local_190 = 0;
              views_04._M_len = 2;
              views_04._M_array = (iterator)&progressArg;
              local_1a8._M_allocated_capacity = (size_type)&local_258;
              cmCatViews(&local_2f8,views_04);
              std::__cxx11::string::operator=((string *)&localName,(string *)&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              pbVar5 = depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar4 = depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                paVar19 = &(depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_2;
                do {
                  plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(paVar19 + -1))->_M_dataplus)._M_p;
                  if (paVar19 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar2) {
                    operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                  }
                  pbVar17 = (pointer)(paVar19 + 1);
                  paVar19 = paVar19 + 2;
                } while (pbVar17 != pbVar5);
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
              }
              pbVar5 = commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar4 = commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                paVar19 = &(commands.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_2;
                do {
                  plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(paVar19 + -1))->_M_dataplus)._M_p;
                  if (paVar19 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar2) {
                    operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                  }
                  pbVar17 = (pointer)(paVar19 + 1);
                  paVar19 = paVar19 + 2;
                } while (pbVar17 != pbVar5);
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
              }
              cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                        ((string *)&progressArg,lg,&makefileName,&localName);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &commands,(string *)&progressArg);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_progressArg != &local_1a8) {
                operator_delete(_progressArg,(ulong)(local_1a8._M_allocated_capacity + 1));
              }
              cmLocalUnixMakefileGenerator3::WriteMakeRule
                        (rootLG,ruleFileStream,"Pre-install relink rule for target.",&localName,
                         &depends,&commands,true,false);
            }
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      ((string *)&progressArg,lg,
                       (puVar15->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,(ulong)(local_1a8._M_allocated_capacity + 1));
            }
            _progressArg = (pointer)localName._M_string_length;
            local_1a8._M_allocated_capacity = 0;
            local_1a8._8_8_ = 6;
            local_198 = "/clean";
            local_190 = 0;
            views_05._M_len = 2;
            views_05._M_array = (iterator)&progressArg;
            cmCatViews(&local_2f8,views_05);
            std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            pbVar5 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                      ((string *)&progressArg,lg,&makefileName,&makeTargetName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &commands,(string *)&progressArg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != &local_1a8) {
              operator_delete(_progressArg,local_1a8._M_allocated_capacity + 1);
            }
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (rootLG,ruleFileStream,"clean rule for target.",&makeTargetName,&depends,
                       &commands,true,false);
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar19 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar19 + -1))->_M_dataplus)._M_p;
                if (paVar19 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar19->_M_allocated_capacity + 1);
                }
                pbVar17 = (pointer)(paVar19 + 1);
                paVar19 = paVar19 + 2;
              } while (pbVar17 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp._M_dataplus._M_p != &tmp.field_2) {
              operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
            }
            puVar14 = local_40;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)progress.Arg._M_dataplus._M_p != &progress.Arg.field_2) {
              operator_delete(progress.Arg._M_dataplus._M_p,
                              CONCAT71(progress.Arg.field_2._M_allocated_capacity._1_7_,
                                       progress.Arg.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
              operator_delete(progress.Dir._M_dataplus._M_p,
                              CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                       progress.Dir.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)makefileName._M_dataplus._M_p != &makefileName.field_2) {
              operator_delete(makefileName._M_dataplus._M_p,
                              CONCAT71(makefileName.field_2._M_allocated_capacity._1_7_,
                                       makefileName.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar14);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTargetName._M_dataplus._M_p != &makeTargetName.field_2) {
    operator_delete(makeTargetName._M_dataplus._M_p,
                    CONCAT71(makeTargetName.field_2._M_allocated_capacity._1_7_,
                             makeTargetName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)localName._M_dataplus._M_p != &localName.field_2) {
    operator_delete(localName._M_dataplus._M_p,
                    CONCAT71(localName.field_2._M_allocated_capacity._1_7_,
                             localName.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  cmLocalUnixMakefileGenerator3& lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  for (const auto& gtarget : lg.GetGeneratorTargets()) {
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        (gtarget->IsInBuildSystem() &&
         gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makefileName = cmStrCat(localName, "/build.make");

      lg.WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = cmStrCat(localName, "/depend");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = cmStrCat(localName, "/build");
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = cmStrCat(lg.GetBinaryDirectory(), "/CMakeFiles");
      {
        std::ostringstream progressArg;
        const char* sep = "";
        for (unsigned long progFile : this->ProgressMap[gtarget.get()].Marks) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (cmValue tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = tgtMsg.IsOn();
      }

      if (targetMessages) {
        lg.AppendEcho(commands, "Built target " + name,
                      cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget.get());
      rootLG.WriteMakeRule(ruleFileStream, "All Build rule for target.",
                           localName, depends, commands, true);

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " "
                << this->CountProgressMarksInTarget(gtarget.get(), emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/Makefile2";
      commands.push_back(lg.GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg.ConvertToOutputFormat(progress.Dir,
                                            cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName =
        cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()), "/rule");
      rootLG.WriteMakeRule(ruleFileStream,
                           "Build rule for subdir invocation for target.",
                           localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      rootLG.WriteMakeRule(ruleFileStream, "Convenience name for target.",
                           name, depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
        localName = cmStrCat(lg.GetRelativeTargetDirectory(gtarget.get()),
                             "/preinstall");
        depends.clear();
        commands.clear();
        commands.push_back(lg.GetRecursiveMakeCall(makefileName, localName));
        rootLG.WriteMakeRule(ruleFileStream,
                             "Pre-install relink rule for target.", localName,
                             depends, commands, true);
      }

      // add the clean rule
      localName = lg.GetRelativeTargetDirectory(gtarget.get());
      makeTargetName = cmStrCat(localName, "/clean");
      depends.clear();
      commands.clear();
      commands.push_back(
        lg.GetRecursiveMakeCall(makefileName, makeTargetName));
      rootLG.WriteMakeRule(ruleFileStream, "clean rule for target.",
                           makeTargetName, depends, commands, true);
      commands.clear();
    }
  }
}